

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPVariantClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPVariantClause *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *this_00;
  size_type sVar4;
  long lVar5;
  OpenMPDirective *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  string local_7c8;
  string local_7a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextVendor>
  *local_5a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextVendor>
  *context_vendor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextKind>
  *local_480;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextKind>
  *context_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
  *local_2d8;
  string local_2d0;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
  local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
  *local_1e0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
  local_1d8;
  iterator iter;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
  *parameter_pair_directives;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  OpenMPClauseKind local_b4;
  OpenMPDirective *pOStack_b0;
  OpenMPClauseKind clause_kind;
  OpenMPDirective *variant_directive;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *parameter_pair_string;
  string ending_symbol;
  string beginning_symbol;
  string parameter_string;
  string clause_string;
  OpenMPVariantClause *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(parameter_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(beginning_symbol.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(ending_symbol.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&parameter_pair_string);
  variant_directive = (OpenMPDirective *)0x0;
  pOStack_b0 = (OpenMPDirective *)0x0;
  local_b4 = OpenMPClause::getKind(&this->super_OpenMPClause);
  if (local_b4 == OMPC_when) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"when");
  }
  else if (local_b4 == OMPC_match) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"match");
  }
  else {
    std::operator<<((ostream *)&std::cout,"The variant clause is not supported.\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," (");
  variant_directive = (OpenMPDirective *)getUserCondition_abi_cxx11_(this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          variant_directive,"");
  if (bVar1) {
    std::operator+(&local_168,"user = {condition(score(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   variant_directive);
    std::operator+(&local_148,&local_168,"): ");
    std::operator+(&local_128,&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variant_directive->clauses);
    std::operator+(&local_108,&local_128,")}");
    std::operator+(&local_e8,&local_108,", ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &variant_directive->clauses,"");
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &parameter_pair_directives,"user = {condition(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variant_directive->clauses);
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &parameter_pair_directives,")}");
      std::operator+(&local_188,&local_1a8,", ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&parameter_pair_directives);
    }
  }
  iter._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
        *)getConstructDirective_abi_cxx11_(this);
  sVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                  *)iter._M_current);
  if (sVar2 != 0) {
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),"construct = {");
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
    ::__normal_iterator(&local_1d8);
    local_1e0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                   ::begin(iter._M_current);
    local_1d8._M_current = local_1e0;
    while( true ) {
      local_1e8._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
              ::end(iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_1d8,&local_1e8);
      if (!bVar1) break;
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
               ::operator*(&local_1d8);
      bVar1 = std::operator!=(&ppVar3->first,"");
      if (bVar1) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
                 ::operator*(&local_1d8);
        std::operator+(&local_228,"score(",&ppVar3->first);
        std::operator+(&local_208,&local_228,"): ");
        std::__cxx11::string::operator=
                  ((string *)(ending_symbol.field_2._M_local_buf + 8),(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::operator=((string *)&parameter_pair_string,")");
      }
      else {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
                 ::operator*(&local_1d8);
        this_00 = OpenMPDirective::getAllClauses(ppVar3->second);
        sVar4 = std::
                map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                ::size(this_00);
        if (sVar4 == 0) {
          std::__cxx11::string::operator=((string *)(ending_symbol.field_2._M_local_buf + 8),"");
          std::__cxx11::string::operator=((string *)&parameter_pair_string,"");
        }
        else {
          std::__cxx11::string::operator=((string *)(ending_symbol.field_2._M_local_buf + 8),"(");
          std::__cxx11::string::operator=((string *)&parameter_pair_string,")");
        }
      }
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
               ::operator*(&local_1d8);
      pOVar6 = ppVar3->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
      std::__cxx11::string::string
                ((string *)&local_2b0,(string *)(ending_symbol.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&local_2d0,(string *)&parameter_pair_string);
      OpenMPDirective::generatePragmaString(&local_268,pOVar6,&local_288,&local_2b0,&local_2d0);
      std::operator+(&local_248,&local_268,", ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      local_2d8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
                   *)__gnu_cxx::
                     __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>_>
                     ::operator++(&local_1d8,0);
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_2f8,(ulong)((long)&parameter_string.field_2 + 8));
    std::__cxx11::string::operator=((string *)(parameter_string.field_2._M_local_buf + 8),local_2f8)
    ;
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::string::operator+=((string *)(parameter_string.field_2._M_local_buf + 8),"}, ");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(parameter_string.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  variant_directive = (OpenMPDirective *)getArchExpression_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      std::operator+(&local_3b8,"arch(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variant_directive->clauses);
      std::operator+(&local_398,&local_3b8,"), ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
  }
  else {
    std::operator+(&local_378,"arch(score(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   variant_directive);
    std::operator+(&local_358,&local_378,"): ");
    std::operator+(&local_338,&local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variant_directive->clauses);
    std::operator+(&local_318,&local_338,"), ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
  }
  variant_directive = (OpenMPDirective *)getIsaExpression_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &context_kind,"isa(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variant_directive->clauses);
      std::operator+(&local_458,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &context_kind,"), ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&context_kind);
    }
  }
  else {
    std::operator+(&local_438,"isa(score(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   variant_directive);
    std::operator+(&local_418,&local_438,"): ");
    std::operator+(&local_3f8,&local_418,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variant_directive->clauses);
    std::operator+(&local_3d8,&local_3f8,"), ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
  }
  local_480 = getContextKind_abi_cxx11_(this);
  switch(local_480->second) {
  case OMPC_CONTEXT_KIND_host:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"host");
    break;
  case OMPC_CONTEXT_KIND_nohost:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"nohost");
    break;
  case OMPC_CONTEXT_KIND_any:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"any");
    break;
  case OMPC_CONTEXT_KIND_cpu:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"cpu");
    break;
  case OMPC_CONTEXT_KIND_gpu:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"gpu");
    break;
  case OMPC_CONTEXT_KIND_fpga:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"fpga");
    break;
  case OMPC_CONTEXT_KIND_unknown:
    break;
  default:
    std::operator<<((ostream *)&std::cout,"The context kind is not supported.\n");
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      std::operator+(&local_540,"kind(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&beginning_symbol.field_2 + 8));
      std::operator+(&local_520,&local_540,"), ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
    }
  }
  else {
    std::operator+(&local_500,"kind(score(",&local_480->first);
    std::operator+(&local_4e0,&local_500,"): ");
    std::operator+(&local_4c0,&local_4e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&beginning_symbol.field_2 + 8));
    std::operator+(&local_4a0,&local_4c0,"), ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_500);
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr
              ((ulong)&context_vendor,(ulong)((long)&parameter_string.field_2 + 8));
    std::operator+(&local_580,"device = {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &context_vendor);
    std::operator+(&local_560,&local_580,"}, ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&context_vendor);
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  local_5a8 = getImplementationKind_abi_cxx11_(this);
  switch(local_5a8->second) {
  case OMPC_CONTEXT_VENDOR_amd:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"amd");
    break;
  case OMPC_CONTEXT_VENDOR_arm:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"arm");
    break;
  case OMPC_CONTEXT_VENDOR_bsc:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"bsc");
    break;
  case OMPC_CONTEXT_VENDOR_cray:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"cray");
    break;
  case OMPC_CONTEXT_VENDOR_fujitsu:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"fujitsu")
    ;
    break;
  case OMPC_CONTEXT_VENDOR_gnu:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"gnu");
    break;
  case OMPC_CONTEXT_VENDOR_ibm:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"ibm");
    break;
  case OMPC_CONTEXT_VENDOR_intel:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"intel");
    break;
  case OMPC_CONTEXT_VENDOR_llvm:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"llvm");
    break;
  case OMPC_CONTEXT_VENDOR_pgi:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"pgi");
    break;
  case OMPC_CONTEXT_VENDOR_ti:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"ti");
    break;
  default:
    std::operator<<((ostream *)&std::cout,"The context vendor is not supported.\n");
    break;
  case OMPC_CONTEXT_VENDOR_unknown:
    std::__cxx11::string::operator=((string *)(beginning_symbol.field_2._M_local_buf + 8),"unknown")
    ;
    break;
  case OMPC_CONTEXT_VENDOR_unspecified:
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      std::operator+(&local_668,"vendor(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&beginning_symbol.field_2 + 8));
      std::operator+(&local_648,&local_668,"), ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_668);
    }
  }
  else {
    std::operator+(&local_628,"vendor(score(",&local_5a8->first);
    std::operator+(&local_608,&local_628,"): ");
    std::operator+(&local_5e8,&local_608,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&beginning_symbol.field_2 + 8));
    std::operator+(&local_5c8,&local_5e8,"), ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
  }
  variant_directive = (OpenMPDirective *)getExtensionExpression_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      std::operator+(&local_728,"extension(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variant_directive->clauses);
      std::operator+(&local_708,&local_728,"), ");
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_708);
      std::__cxx11::string::~string((string *)&local_708);
      std::__cxx11::string::~string((string *)&local_728);
    }
  }
  else {
    std::operator+(&local_6e8,"extension(score(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   variant_directive);
    std::operator+(&local_6c8,&local_6e8,"): ");
    std::operator+(&local_6a8,&local_6c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variant_directive->clauses);
    std::operator+(&local_688,&local_6a8,"), ");
    std::__cxx11::string::operator+=
              ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_788,(ulong)((long)&parameter_string.field_2 + 8));
    std::operator+(&local_768,"implementation = {",&local_788);
    std::operator+(&local_748,&local_768,"}, ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_748);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_788);
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_7a8,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_7a8);
  std::__cxx11::string::~string(local_7a8);
  if (local_b4 == OMPC_when) {
    std::__cxx11::string::operator=((string *)(parameter_string.field_2._M_local_buf + 8)," : ");
    pOVar6 = OpenMPWhenClause::getVariantDirective((OpenMPWhenClause *)this);
    pOStack_b0 = pOVar6;
    if (pOVar6 != (OpenMPDirective *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"",&local_7e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"",&local_811);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"",&local_839);
      OpenMPDirective::generatePragmaString(&local_7c8,pOVar6,&local_7e8,&local_810,&local_838);
      std::__cxx11::string::operator+=
                ((string *)(parameter_string.field_2._M_local_buf + 8),(string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_838);
      std::allocator<char>::~allocator(&local_839);
      std::__cxx11::string::~string((string *)&local_810);
      std::allocator<char>::~allocator(&local_811);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::allocator<char>::~allocator(&local_7e9);
    }
  }
  std::operator+(&local_860,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&parameter_string.field_2 + 8),") ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_860);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&parameter_pair_string);
  std::__cxx11::string::~string((string *)(ending_symbol.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(beginning_symbol.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(parameter_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPVariantClause::toString() {

    std::string result;
    std::string clause_string;
    std::string parameter_string;
    std::string beginning_symbol;
    std::string ending_symbol;
    std::pair<std::string, std::string>* parameter_pair_string = NULL;
    OpenMPDirective* variant_directive = NULL;
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            result = "when";
            break;
        case OMPC_match:
            result = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    result += " (";

    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->first != "") {
        clause_string += "user = {condition(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + ")}" + ", ";
    }
    else if (parameter_pair_string->second != "") {
        clause_string += "user = {condition(" + parameter_pair_string->second + ")}" + ", ";
    };

    // check construct
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        clause_string += "construct = {";
        std::vector<std::pair<std::string, OpenMPDirective*> >::iterator iter;
        for (iter = parameter_pair_directives->begin(); iter != parameter_pair_directives->end(); iter++) {
            if ((*iter).first != "") {
                beginning_symbol = "score(" + (*iter).first + "): ";
                ending_symbol = ")";
            }
            else if ((*iter).second->getAllClauses()->size() != 0){
                beginning_symbol = "(";
                ending_symbol = ")";
            }
            else {
                beginning_symbol = "";
                ending_symbol = "";
            };
            clause_string += (*iter).second->generatePragmaString("", beginning_symbol, ending_symbol) + ", ";
        };
        clause_string = clause_string.substr(0, clause_string.size()-2);
        clause_string += "}, ";
    }

    result += clause_string;
    parameter_string.clear();

    // check device
    clause_string.clear();
    // check device arch
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "arch(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "arch(" + parameter_pair_string->second + "), ";
    };

    // check device isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "isa(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "isa(" + parameter_pair_string->second + "), ";
    };

    // check device_kind
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (context_kind->first.size() > 0) {
        clause_string += "kind(score(" + context_kind->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "kind(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "device = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    std::pair<std::string, OpenMPClauseContextVendor>* context_vendor = this->getImplementationKind();
    switch (context_vendor->second) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (context_vendor->first.size() > 0) {
        clause_string += "vendor(score(" + context_vendor->first + "): " + parameter_string + "), ";
    }
    else if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_pair_string = this->getExtensionExpression();
    if (parameter_pair_string->first.size() > 0) {
        clause_string += "extension(score(" + parameter_pair_string->first + "): " + parameter_pair_string->second + "), ";
    }
    else if (parameter_pair_string->second.size() > 0) {
        clause_string += "extension(" + parameter_pair_string->second + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);

    if (clause_kind == OMPC_when) {
        clause_string = " : ";
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            clause_string += variant_directive->generatePragmaString("");
        };
    };

    result += clause_string + ") ";

    return result;
}